

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

void __thiscall QRhiWidget::~QRhiWidget(QRhiWidget *this)

{
  QRhiWidget *in_stack_00000010;
  
  ~QRhiWidget(in_stack_00000010);
  return;
}

Assistant:

QRhiWidget::~QRhiWidget()
{
    Q_D(QRhiWidget);

    if (d->rhi) {
        d->rhi->removeCleanupCallback(this);
        // rhi resources must be destroyed here, due to how QWidget teardown works;
        // it should not be left to the private object's destruction.
        d->resetRenderTargetObjects();
        d->resetColorBufferObjects();
        qDeleteAll(d->pendingDeletes);
    }

    d->offscreenRenderer.reset();
}